

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenize.cpp
# Opt level: O2

vector<skiwi::token,_std::allocator<skiwi::token>_> *
skiwi::tokenize(vector<skiwi::token,_std::allocator<skiwi::token>_> *__return_storage_ptr__,
               string *str)

{
  byte *pbVar1;
  char cVar2;
  long lVar3;
  int iVar4;
  byte bVar5;
  char cVar6;
  byte *pbVar7;
  byte *pbVar8;
  byte *pbVar9;
  bool bVar10;
  bool is_a_symbol;
  int local_258;
  int line_nr;
  int temp_line_nr;
  int temp_column_nr;
  string buff;
  e_type local_224;
  byte *local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_218;
  size_type local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  undefined4 local_1d8 [8];
  stringstream str_1;
  undefined4 uStack_1b4;
  ostream local_1a8 [376];
  
  (__return_storage_ptr__->super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  buff._M_dataplus._M_p = (pointer)&buff.field_2;
  buff._M_string_length = 0;
  (__return_storage_ptr__->super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<skiwi::token,_std::allocator<skiwi::token>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  bVar10 = false;
  buff.field_2._M_local_buf[0] = '\0';
  pbVar8 = (byte *)(str->_M_dataplus)._M_p;
  pbVar7 = pbVar8 + str->_M_string_length;
  is_a_symbol = false;
  local_258 = 1;
  line_nr = local_258;
  local_220 = pbVar7;
  do {
    if (pbVar7 <= pbVar8) {
      anon_unknown_3::_treat_buffer(&buff,__return_storage_ptr__,line_nr,local_258,&is_a_symbol);
      std::__cxx11::string::~string((string *)&buff);
      return __return_storage_ptr__;
    }
    bVar5 = *pbVar8;
    if (((ulong)bVar5 < 0x21) && ((0x100002600U >> ((ulong)bVar5 & 0x3f) & 1) != 0)) {
      anon_unknown_3::_treat_buffer(&buff,__return_storage_ptr__,line_nr,local_258,&is_a_symbol);
      iVar4 = line_nr;
      do {
        bVar5 = *pbVar8;
        if (((bVar5 != 9) && (bVar5 != 0x20)) && (bVar5 != 0xd)) {
          if (bVar5 != 10) goto LAB_00256c45;
          iVar4 = iVar4 + 1;
          local_258 = 0;
          line_nr = iVar4;
        }
        pbVar8 = pbVar8 + 1;
        local_258 = local_258 + 1;
      } while( true );
    }
    pbVar9 = pbVar8;
    if (bVar10) goto switchD_00256c62_caseD_24;
LAB_00256c45:
    pbVar9 = pbVar8;
    switch(bVar5) {
    case 0x22:
      anon_unknown_3::_treat_buffer(&buff,__return_storage_ptr__,line_nr,local_258,&is_a_symbol);
      temp_column_nr = local_258;
      temp_line_nr = line_nr;
      iVar4 = line_nr;
      do {
        pbVar7 = pbVar9;
        pbVar9 = pbVar7 + 1;
        local_258 = local_258 + 1;
        bVar5 = pbVar7[1];
        if (bVar5 == 10) {
          local_258 = 0;
          iVar4 = iVar4 + 1;
          bVar5 = *pbVar9;
          line_nr = iVar4;
        }
        else if ((bVar5 == 0) || (bVar5 == 0x22)) goto LAB_00256d24;
      } while ((bVar5 != 0x5c) || (pbVar9 = pbVar7 + 2, pbVar7[2] != 0));
      local_1d8[0] = 0;
      _str_1 = (pointer)local_1a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&str_1,pbVar8,pbVar9);
      std::vector<skiwi::token,std::allocator<skiwi::token>>::
      emplace_back<skiwi::token::e_type,std::__cxx11::string,int&,int&>
                ((vector<skiwi::token,std::allocator<skiwi::token>> *)__return_storage_ptr__,
                 (e_type *)local_1d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&str_1,
                 &temp_line_nr,&temp_column_nr);
      std::__cxx11::string::~string((string *)&str_1);
      bVar5 = *pbVar9;
LAB_00256d24:
      if (bVar5 != 0) {
        pbVar9 = pbVar9 + 1;
        local_258 = local_258 + 1;
      }
      local_224 = T_STRING;
      local_218 = &local_208;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,pbVar8,pbVar9);
      cVar6 = (char)(string *)&local_218;
      lVar3 = std::__cxx11::string::find(cVar6,0x5c);
      if (lVar3 == -1) {
        local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
        if (local_218 == &local_208) {
          local_1f8.field_2._8_8_ = local_208._8_8_;
        }
        else {
          local_1f8._M_dataplus._M_p = (pointer)local_218;
        }
        local_1f8.field_2._M_allocated_capacity._1_7_ = local_208._M_allocated_capacity._1_7_;
        local_1f8.field_2._M_local_buf[0] = local_208._M_local_buf[0];
        local_1f8._M_string_length = local_210;
        local_210 = 0;
        local_208._M_local_buf[0] = '\0';
        local_218 = &local_208;
      }
      else {
        std::__cxx11::stringstream::stringstream((stringstream *)&str_1);
        while (lVar3 != -1) {
          std::__cxx11::string::substr((ulong)local_1d8,(ulong)&local_218);
          std::operator<<(local_1a8,(string *)local_1d8);
          std::__cxx11::string::~string((string *)local_1d8);
          cVar2 = local_218->_M_local_buf[lVar3 + 1];
          if (cVar2 == 'a') {
            cVar2 = '\a';
          }
          else if (cVar2 == 'b') {
            cVar2 = '\b';
          }
          else if (cVar2 == 'n') {
            cVar2 = '\n';
          }
          else if (cVar2 == 'r') {
            cVar2 = '\r';
          }
          else if (cVar2 == 't') {
            cVar2 = '\t';
          }
          std::operator<<(local_1a8,cVar2);
          std::__cxx11::string::substr((ulong)local_1d8,(ulong)&local_218);
          std::__cxx11::string::operator=((string *)&local_218,(string *)local_1d8);
          std::__cxx11::string::~string((string *)local_1d8);
          lVar3 = std::__cxx11::string::find(cVar6,0x5c);
        }
        std::operator<<(local_1a8,(string *)&local_218);
        std::__cxx11::stringbuf::str();
        std::__cxx11::stringstream::~stringstream((stringstream *)&str_1);
      }
      std::vector<skiwi::token,std::allocator<skiwi::token>>::
      emplace_back<skiwi::token::e_type,std::__cxx11::string,int&,int&>
                ((vector<skiwi::token,std::allocator<skiwi::token>> *)__return_storage_ptr__,
                 &local_224,&local_1f8,&temp_line_nr,&temp_column_nr);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::__cxx11::string::~string((string *)&local_218);
      goto LAB_002572bd;
    case 0x23:
      if (is_a_symbol != false) goto switchD_00256c62_caseD_24;
      anon_unknown_3::_treat_buffer(&buff,__return_storage_ptr__,line_nr,local_258,&is_a_symbol);
      if (pbVar8[1] == 0x7c) {
        local_258 = local_258 + 1;
        bVar10 = false;
        pbVar9 = pbVar8 + 2;
        iVar4 = line_nr;
LAB_00257218:
        if (!bVar10) {
          do {
            pbVar7 = pbVar9 + 1;
            bVar5 = *pbVar9;
            if (bVar5 == 10) {
              iVar4 = iVar4 + 1;
              local_258 = 0;
              line_nr = iVar4;
            }
            else {
              if (bVar5 == 0) {
                bVar10 = true;
                goto LAB_00257218;
              }
              if (bVar5 == 0x7c) goto LAB_00257246;
            }
            local_258 = local_258 + 1;
            pbVar9 = pbVar7;
          } while( true );
        }
        goto LAB_002571c6;
      }
      pbVar1 = pbVar8;
      if (pbVar8[1] == 0x3b) {
        do {
          pbVar9 = pbVar1 + 1;
          bVar5 = *pbVar1;
          if (bVar5 == 0) break;
          pbVar1 = pbVar9;
        } while (bVar5 != 10);
        goto LAB_0025706d;
      }
      is_a_symbol = true;
      break;
    case 0x24:
    case 0x25:
    case 0x26:
    case 0x2a:
    case 0x2b:
      goto switchD_00256c62_caseD_24;
    case 0x27:
      anon_unknown_3::_treat_buffer(&buff,__return_storage_ptr__,line_nr,local_258,&is_a_symbol);
      _str_1 = 1;
      std::vector<skiwi::token,std::allocator<skiwi::token>>::
      emplace_back<skiwi::token::e_type,char_const(&)[2],int&,int&>
                ((vector<skiwi::token,std::allocator<skiwi::token>> *)__return_storage_ptr__,
                 (e_type *)&str_1,(char (*) [2])"\'",&line_nr,&local_258);
      break;
    case 0x28:
      if ((is_a_symbol == true) && (buff._M_string_length == 0)) {
        is_a_symbol = false;
        _str_1 = 5;
        std::vector<skiwi::token,std::allocator<skiwi::token>>::
        emplace_back<skiwi::token::e_type,char_const(&)[3],int&,int&>
                  ((vector<skiwi::token,std::allocator<skiwi::token>> *)__return_storage_ptr__,
                   (e_type *)&str_1,(char (*) [3])"#(",&line_nr,&local_258);
      }
      else {
        anon_unknown_3::_treat_buffer(&buff,__return_storage_ptr__,line_nr,local_258,&is_a_symbol);
        _str_1 = 5;
        std::vector<skiwi::token,std::allocator<skiwi::token>>::
        emplace_back<skiwi::token::e_type,char_const(&)[2],int&,int&>
                  ((vector<skiwi::token,std::allocator<skiwi::token>> *)__return_storage_ptr__,
                   (e_type *)&str_1,(char (*) [2])0x25f225,&line_nr,&local_258);
      }
      break;
    case 0x29:
      anon_unknown_3::_treat_buffer(&buff,__return_storage_ptr__,line_nr,local_258,&is_a_symbol);
      _str_1 = 6;
      std::vector<skiwi::token,std::allocator<skiwi::token>>::
      emplace_back<skiwi::token::e_type,char_const(&)[2],int&,int&>
                ((vector<skiwi::token,std::allocator<skiwi::token>> *)__return_storage_ptr__,
                 (e_type *)&str_1,(char (*) [2])0x25d154,&line_nr,&local_258);
      break;
    case 0x2c:
      anon_unknown_3::_treat_buffer(&buff,__return_storage_ptr__,line_nr,local_258,&is_a_symbol);
      if (pbVar8[1] == 0x40) {
        _str_1 = 4;
        std::vector<skiwi::token,std::allocator<skiwi::token>>::
        emplace_back<skiwi::token::e_type,char_const(&)[3],int&,int&>
                  ((vector<skiwi::token,std::allocator<skiwi::token>> *)__return_storage_ptr__,
                   (e_type *)&str_1,(char (*) [3])",@",&line_nr,&local_258);
        local_258 = local_258 + 1;
        pbVar9 = pbVar8 + 1;
      }
      else {
        _str_1 = 3;
        std::vector<skiwi::token,std::allocator<skiwi::token>>::
        emplace_back<skiwi::token::e_type,char_const(&)[2],int&,int&>
                  ((vector<skiwi::token,std::allocator<skiwi::token>> *)__return_storage_ptr__,
                   (e_type *)&str_1,(char (*) [2])",",&line_nr,&local_258);
      }
LAB_002571c6:
      pbVar9 = pbVar9 + 1;
      local_258 = local_258 + 1;
LAB_002572bd:
      pbVar7 = local_220;
      if (pbVar8 == pbVar9) {
switchD_00256c62_caseD_24:
        std::__cxx11::string::push_back((char)&buff);
        pbVar8 = pbVar9;
        break;
      }
      goto LAB_002572ec;
    default:
      if (bVar5 == 0x3b) {
        anon_unknown_3::_treat_buffer(&buff,__return_storage_ptr__,line_nr,local_258,&is_a_symbol);
        pbVar7 = pbVar8;
        do {
          pbVar9 = pbVar7 + 1;
          bVar5 = *pbVar7;
          if (bVar5 == 0) break;
          pbVar7 = pbVar9;
        } while (bVar5 != 10);
LAB_0025706d:
        line_nr = line_nr + 1;
        local_258 = 1;
        goto LAB_002572bd;
      }
      if (bVar5 == 0x5b) {
        anon_unknown_3::_treat_buffer(&buff,__return_storage_ptr__,line_nr,local_258,&is_a_symbol);
        _str_1 = 7;
        std::vector<skiwi::token,std::allocator<skiwi::token>>::
        emplace_back<skiwi::token::e_type,char_const(&)[2],int&,int&>
                  ((vector<skiwi::token,std::allocator<skiwi::token>> *)__return_storage_ptr__,
                   (e_type *)&str_1,(char (*) [2])"[",&line_nr,&local_258);
      }
      else if (bVar5 == 0x5d) {
        anon_unknown_3::_treat_buffer(&buff,__return_storage_ptr__,line_nr,local_258,&is_a_symbol);
        _str_1 = 8;
        std::vector<skiwi::token,std::allocator<skiwi::token>>::
        emplace_back<skiwi::token::e_type,char_const(&)[2],int&,int&>
                  ((vector<skiwi::token,std::allocator<skiwi::token>> *)__return_storage_ptr__,
                   (e_type *)&str_1,(char (*) [2])0x25cc95,&line_nr,&local_258);
      }
      else {
        if (bVar5 != 0x60) goto switchD_00256c62_caseD_24;
        anon_unknown_3::_treat_buffer(&buff,__return_storage_ptr__,line_nr,local_258,&is_a_symbol);
        _str_1 = 2;
        std::vector<skiwi::token,std::allocator<skiwi::token>>::
        emplace_back<skiwi::token::e_type,char_const(&)[2],int&,int&>
                  ((vector<skiwi::token,std::allocator<skiwi::token>> *)__return_storage_ptr__,
                   (e_type *)&str_1,(char (*) [2])"`",&line_nr,&local_258);
      }
    }
    pbVar9 = pbVar8 + 1;
    local_258 = local_258 + 1;
LAB_002572ec:
    bVar10 = false;
    pbVar8 = pbVar9;
    if ((is_a_symbol == true) && (buff._M_string_length == 1)) {
      bVar10 = *buff._M_dataplus._M_p == '\\';
    }
  } while( true );
LAB_00257246:
  bVar10 = *pbVar7 == 0x23;
  pbVar9 = pbVar7;
  goto LAB_00257218;
}

Assistant:

std::vector<token> tokenize(const std::string& str)
  {
  std::vector<token> tokens;
  std::string buff;

  const char* s = str.c_str();
  const char* s_end = str.c_str() + str.length();

  bool is_a_symbol = false;
  bool is_a_character = false;

  int line_nr = 1;
  int column_nr = 1;

  while (s < s_end)
    {
    //if (*s == ' ' || *s == '\n')
    if (ignore_character(*s))
      {
      _treat_buffer(buff, tokens, line_nr, column_nr, is_a_symbol);
      is_a_character = false;
      //while (*s == ' ' || *s == '\n')
      while (ignore_character(*s))
        {
        if (*s == '\n')
          {
          ++line_nr;
          column_nr = 0;
          }
        ++s;
        ++column_nr;
        }
      }

    const char* s_copy = s;
    if (!is_a_character) // any special sign can appear as a character, e.g. #\(
      {
      switch (*s)
        {
        case '(':
        {
        if (is_a_symbol && buff.empty()) // #(
          {
          is_a_symbol = false;
          tokens.emplace_back(token::T_LEFT_ROUND_BRACKET, "#(", line_nr, column_nr);
          ++s;
          ++column_nr;
          break;
          }
        _treat_buffer(buff, tokens, line_nr, column_nr, is_a_symbol);
        tokens.emplace_back(token::T_LEFT_ROUND_BRACKET, "(", line_nr, column_nr);
        ++s;
        ++column_nr;
        break;
        }
        case ')':
        {
        _treat_buffer(buff, tokens, line_nr, column_nr, is_a_symbol);
        tokens.emplace_back(token::T_RIGHT_ROUND_BRACKET, ")", line_nr, column_nr);
        ++s;
        ++column_nr;
        break;
        }
        case '[':
        {
        _treat_buffer(buff, tokens, line_nr, column_nr, is_a_symbol);
        tokens.emplace_back(token::T_LEFT_SQUARE_BRACKET, "[", line_nr, column_nr);
        ++s;
        ++column_nr;
        break;
        }
        case ']':
        {
        _treat_buffer(buff, tokens, line_nr, column_nr, is_a_symbol);
        tokens.emplace_back(token::T_RIGHT_SQUARE_BRACKET, "]", line_nr, column_nr);
        ++s;
        ++column_nr;
        break;
        }
        case '#':
        {
        if (is_a_symbol)
          break;
        _treat_buffer(buff, tokens, line_nr, column_nr, is_a_symbol);
        const char* t = s;
        ++t;
        if (t && *t == ';') //treat as comment
          {
          while (*s && *s != '\n') // comment, so skip till end of the line
            ++s;
          ++s;
          ++line_nr;
          column_nr = 1;
          }
        else if (t && *t == '|') //treat as multiline comment
          {
          s = t;
          ++s; ++column_nr;
          bool end_of_comment_found = false;
          while (!end_of_comment_found)
            {
            while (*s && *s != '|')
              {
              if (*s == '\n')
                {
                ++line_nr;
                column_nr = 0;
                }
              ++s;
              ++column_nr;
              }
            if (!(*s) || (*(++s) == '#'))
              end_of_comment_found = true;
            }
          ++s; ++column_nr;
          }
        else
          {
          is_a_symbol = true;
          ++s;
          ++column_nr;
          }
        break;
        }
        case ';':
        {
        _treat_buffer(buff, tokens, line_nr, column_nr, is_a_symbol);
        while (*s && *s != '\n') // comment, so skip till end of the line
          ++s;
        ++s;
        ++line_nr;
        column_nr = 1;
        break;
        }
        case '\'':
        {
        _treat_buffer(buff, tokens, line_nr, column_nr, is_a_symbol);
        tokens.emplace_back(token::T_QUOTE, "'", line_nr, column_nr);
        ++s;
        ++column_nr;
        break;
        }
        case '`':
        {
        _treat_buffer(buff, tokens, line_nr, column_nr, is_a_symbol);
        tokens.emplace_back(token::T_BACKQUOTE, "`", line_nr, column_nr);
        ++s;
        ++column_nr;
        break;
        }
        case ',':
        {
        _treat_buffer(buff, tokens, line_nr, column_nr, is_a_symbol);
        const char* t = s;
        ++t;
        if (*t && *t == '@')
          {
          tokens.emplace_back(token::T_UNQUOTE_SPLICING, ",@", line_nr, column_nr);
          ++s;
          ++column_nr;
          }
        else
          {
          tokens.emplace_back(token::T_UNQUOTE, ",", line_nr, column_nr);
          }
        ++s;
        ++column_nr;
        break;
        }
        case '"':
        {
        _treat_buffer(buff, tokens, line_nr, column_nr, is_a_symbol);
        int temp_column_nr = column_nr;
        int temp_line_nr = line_nr;
        const char* t = s;
        ++t;
        ++column_nr;
        while (*t && *t != '"')
          {
          if (*t == '\n')
            {
            ++line_nr;
            column_nr = 0;
            }
          if (*t == '\\') // escape syntax
            {
            ++t;
            if (!*t)
              {
              tokens.emplace_back(token::T_BAD, std::string(s, t), temp_line_nr, temp_column_nr);
              break;
              }
            }
          ++t;
          ++column_nr;
          }
        if (*t)
          {
          ++t;
          ++column_nr;
          }
        tokens.emplace_back(token::T_STRING, replace_escape_chars(std::string(s, t)), temp_line_nr, temp_column_nr);
        s = t;
        break;
        }
        }
      }

    if (s_copy == s)
      {
      buff += *s;
      ++s;
      ++column_nr;
      }

    is_a_character = (is_a_symbol && buff.size() == 1 && buff[0] == '\\');
    }

  _treat_buffer(buff, tokens, line_nr, column_nr, is_a_symbol);

  return tokens;
  }